

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeMovePRegPair(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint RegPair;
  
  uVar1 = fieldFromInstruction(in_ESI,7,3);
  switch(uVar1) {
  case 0:
    MCOperand_CreateReg0(in_RDI,0x17);
    MCOperand_CreateReg0(in_RDI,0x18);
    break;
  case 1:
    MCOperand_CreateReg0(in_RDI,0x17);
    MCOperand_CreateReg0(in_RDI,0x19);
    break;
  case 2:
    MCOperand_CreateReg0(in_RDI,0x18);
    MCOperand_CreateReg0(in_RDI,0x19);
    break;
  case 3:
    MCOperand_CreateReg0(in_RDI,0x16);
    MCOperand_CreateReg0(in_RDI,0x11b);
    break;
  case 4:
    MCOperand_CreateReg0(in_RDI,0x16);
    MCOperand_CreateReg0(in_RDI,0x11c);
    break;
  case 5:
    MCOperand_CreateReg0(in_RDI,0x16);
    MCOperand_CreateReg0(in_RDI,0x17);
    break;
  case 6:
    MCOperand_CreateReg0(in_RDI,0x16);
    MCOperand_CreateReg0(in_RDI,0x18);
    break;
  case 7:
    MCOperand_CreateReg0(in_RDI,0x16);
    MCOperand_CreateReg0(in_RDI,0x19);
    break;
  default:
    return MCDisassembler_Fail;
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMovePRegPair(MCInst *Inst, unsigned Insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned RegPair = fieldFromInstruction(Insn, 7, 3);

	switch (RegPair) {
		default:
			return MCDisassembler_Fail;
		case 0:
			MCOperand_CreateReg0(Inst, Mips_A1);
			MCOperand_CreateReg0(Inst, Mips_A2);
			break;
		case 1:
			MCOperand_CreateReg0(Inst, Mips_A1);
			MCOperand_CreateReg0(Inst, Mips_A3);
			break;
		case 2:
			MCOperand_CreateReg0(Inst, Mips_A2);
			MCOperand_CreateReg0(Inst, Mips_A3);
			break;
		case 3:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_S5);
			break;
		case 4:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_S6);
			break;
		case 5:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_A1);
			break;
		case 6:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_A2);
			break;
		case 7:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_A3);
			break;
	}

	return MCDisassembler_Success;
}